

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_benchmark.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  istream *piVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_72e;
  allocator<char> local_72d;
  allocator<char> local_72c;
  allocator<char> local_72b;
  allocator<char> local_72a;
  allocator<char> local_729;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_728;
  int local_71c;
  string line;
  AVLTree<int> avlTree;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  fstream output_file;
  ostream local_638 [16];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [240];
  ifstream input_file;
  byte abStack_418 [488];
  ofstream output_file1;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&path,&kDatasetPath,(allocator<char> *)&output_file);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&output_file,&kProjectPath,(allocator<char> *)&input_file);
  std::operator+(&output_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_file,
                 "/benchmark/result/findResults.csv");
  std::__cxx11::string::~string((string *)&output_file);
  std::ofstream::ofstream(&output_file1,(string *)&output_path,_S_out);
  std::ofstream::close();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_file,"100",(allocator<char> *)&input_file);
  std::__cxx11::string::string<std::allocator<char>>(local_628,"500",(allocator<char> *)&line);
  std::__cxx11::string::string<std::allocator<char>>(local_608,"1000",(allocator<char> *)&local_668)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_5e8,"5000",(allocator<char> *)&local_688)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_5c8,"10000",(allocator<char> *)&avlTree);
  std::__cxx11::string::string<std::allocator<char>>(local_5a8,"50000",&local_729);
  std::__cxx11::string::string<std::allocator<char>>(local_588,"100000",&local_72a);
  std::__cxx11::string::string<std::allocator<char>>(local_568,"500000",&local_72b);
  std::__cxx11::string::string<std::allocator<char>>(local_548,"1000000",&local_72c);
  std::__cxx11::string::string<std::allocator<char>>(local_528,"5000000",&local_72d);
  __l._M_len = 10;
  __l._M_array = (iterator)&output_file;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&files,__l,&local_72e);
  lVar4 = 0x120;
  do {
    std::__cxx11::string::~string((string *)(&output_file + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  itis::AVLTree<int>::AVLTree(&avlTree);
  while (local_728 = files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    local_71c = 1;
    while( true ) {
      if (local_71c == 0xb) break;
      std::operator+(&local_668,&path,"/");
      std::operator+(&line,&local_668,local_728);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &output_file,&line,".csv");
      std::ifstream::ifstream((istream *)&input_file,(string *)&output_file,_S_in);
      std::__cxx11::string::~string((string *)&output_file);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&local_668);
      std::operator+(&line,&path,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &output_file,&line,local_728);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&output_file);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&output_file);
      std::__cxx11::string::~string((string *)&line);
      if ((abStack_418[*(long *)(_input_file + -0x18)] & 5) == 0) {
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)&input_file,(string *)&line,','),
              ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)&output_file,(string *)&line,_S_out|_S_in);
          iVar1 = std::__cxx11::stoi(&line,(size_t *)0x0,10);
          itis::AVLTree<int>::insert(&avlTree,iVar1);
          std::__cxx11::stringstream::~stringstream((stringstream *)&output_file);
        }
        std::__cxx11::string::~string((string *)&line);
      }
      std::ifstream::close();
      std::operator+(&local_688,&path,"/");
      std::operator+(&local_668,&local_688,local_728);
      std::operator+(&line,&local_668,".csv");
      std::ifstream::ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_file,
                 (string *)&line,_S_in);
      std::ifstream::operator=((istream *)&input_file,(ifstream *)&output_file);
      std::ifstream::~ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_file);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string((string *)&local_688);
      if ((abStack_418[*(long *)(_input_file + -0x18)] & 5) == 0) {
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)&input_file,(string *)&line,','),
              ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)&output_file,(string *)&line,_S_out|_S_in);
          std::chrono::_V2::system_clock::now();
          iVar1 = std::__cxx11::stoi(&line,(size_t *)0x0,10);
          itis::AVLTree<int>::find(&avlTree,iVar1);
          std::chrono::_V2::system_clock::now();
          std::__cxx11::stringstream::~stringstream((stringstream *)&output_file);
        }
        std::__cxx11::string::~string((string *)&line);
      }
      poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar2);
      itis::AVLTree<int>::clear(&avlTree);
      std::ifstream::close();
      std::fstream::fstream(&output_file,(string *)&output_path,_S_app);
      poVar2 = std::operator<<(local_638,(string *)local_728);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_71c);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::fstream::close();
      std::fstream::~fstream(&output_file);
      std::ifstream::~ifstream((istream *)&input_file);
      local_71c = local_71c + 1;
    }
    local_71c = 0xb;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_728 + 1;
  }
  itis::AVLTree<int>::~AVLTree(&avlTree);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  std::ofstream::~ofstream(&output_file1);
  std::__cxx11::string::~string((string *)&output_path);
  std::__cxx11::string::~string((string *)&path);
  return 0;
}

Assistant:

int main() {
  // Tip 1: входные аргументы позволяют более гибко контролировать параметры вашей программы
  const auto path = string(kDatasetPath);
  const auto output_path = string(kProjectPath) + "/benchmark/result/findResults.csv";

  auto output_file1 = ofstream(output_path);
  output_file1.close();
  // работа с набором данных
  vector<string> files = {"100", "500", "1000", "5000", "10000", "50000", "100000", "500000", "1000000", "5000000"};
  AVLTree<int> avlTree;

  for (const string& file : files) {  // Проходим по всем 10 .csv файлам
    for (int i = 1; i < 11; i++) {    // Запускаем замерку времени 10 раз
      auto input_file = ifstream(path + "/" + file + ".csv");
      cout << (path + "/" + file) << endl;

      if (input_file) {
        int line_number = 0;
        for (string line; getline(input_file, line, ','); /* ... */) {
          auto ss = stringstream(line);  // оборачиваем строку в объект "поток"
          avlTree.insert(stoi(line));
          line_number++;
        }
      }
      input_file.close();

      input_file = ifstream(path + "/" + file + ".csv");
      auto time_diff_find = chrono::nanoseconds::zero();
      //         здесь находится участок кода, время которого необходимо замерить
      if (input_file) {
        int line_number = 0;
        for (string line; getline(input_file, line, ','); /* ... */) {
          auto ss = stringstream(line);
          const auto time_point_before_find = chrono::high_resolution_clock::now();
          avlTree.find(stoi(line));
          const auto time_point_after_find = chrono::high_resolution_clock::now();
          line_number++;
          time_diff_find += time_point_after_find - time_point_before_find;
        }
      }

      const auto time_elapsed_ns_find = chrono::duration_cast<chrono::nanoseconds>(time_diff_find).count();
      cout << time_elapsed_ns_find << endl;

      avlTree.clear();
      input_file.close();

      //Открываем файл для записи и вносим полученые данные
      auto output_file = fstream(output_path, ios::app);
      output_file << file << "," << i << "," << time_elapsed_ns_find << endl;
      output_file.close();
    }
  }
  return 0;
}